

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O3

channel_t * __thiscall
Effects_Buffer::channel(channel_t *__return_storage_ptr__,Effects_Buffer *this,int i,int type)

{
  Blip_Buffer *pBVar1;
  uint uVar2;
  
  if (type == 0) {
    uVar2 = 2;
    if (i % 5 < 2) {
      uVar2 = i % 5;
    }
  }
  else {
    uVar2 = 2;
    if (((uint)type >> 9 & 1) == 0) {
      uVar2 = 2;
      if (0x55 < (byte)((char)type * -0x55)) {
        uVar2 = type & 1;
      }
    }
  }
  __return_storage_ptr__->right = this->chan_types[(int)uVar2].right;
  pBVar1 = this->chan_types[(int)uVar2].left;
  __return_storage_ptr__->center = this->chan_types[(int)uVar2].center;
  __return_storage_ptr__->left = pBVar1;
  return __return_storage_ptr__;
}

Assistant:

Effects_Buffer::channel_t Effects_Buffer::channel( int i, int type )
{
	int out = 2;
	if ( !type )
	{
		out = i % 5;
		if ( out > 2 )
			out = 2;
	}
	else if ( !(type & noise_type) && (type & type_index_mask) % 3 != 0 )
	{
		out = type & 1;
	}
	return chan_types [out];
}